

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# by_all.hpp
# Opt level: O2

tuple<char_&,_char_&>
burst::detail::
by_all_impl<0ul,1ul,burst::front_t,std::tuple<boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>&,boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>&>>
          (_Tuple_impl<1UL,_char_&> param_1,undefined8 param_2,undefined8 *param_3)

{
  reference pcVar1;
  reference pcVar2;
  _Head_base<0UL,_char_&,_false> extraout_RDX;
  tuple<char_&,_char_&> tVar3;
  
  pcVar1 = boost::iterator_range_detail::
           iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
           ::front((iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
                    *)param_3[1]);
  pcVar2 = boost::iterator_range_detail::
           iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
           ::front((iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
                    *)*param_3);
  *(reference *)param_1.super__Head_base<1UL,_char_&,_false>._M_head_impl = pcVar2;
  *(reference *)((long)param_1.super__Head_base<1UL,_char_&,_false>._M_head_impl + 8) = pcVar1;
  tVar3.super__Tuple_impl<0UL,_char_&,_char_&>.super__Head_base<0UL,_char_&,_false>._M_head_impl =
       extraout_RDX._M_head_impl;
  tVar3.super__Tuple_impl<0UL,_char_&,_char_&>.super__Tuple_impl<1UL,_char_&>.
  super__Head_base<1UL,_char_&,_false>._M_head_impl =
       param_1.super__Head_base<1UL,_char_&,_false>._M_head_impl;
  return (tuple<char_&,_char_&>)tVar3.super__Tuple_impl<0UL,_char_&,_char_&>;
}

Assistant:

constexpr decltype(auto)
            by_all_impl (std::index_sequence<Indices...>, UnaryFunction & f, Tuple && t)
        {
            return
                std::tuple
                <
                    invoke_result_t
                    <
                        UnaryFunction &, std::tuple_element_t<Indices, std::decay_t<Tuple>>
                    >...
                >
                (
                    f(std::get<Indices>(std::forward<Tuple>(t)))...
                );
        }